

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-strtok.c
# Opt level: O3

int run_test_strtok(void)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  int extraout_EAX;
  undefined8 uVar6;
  char *__s;
  ulong uVar7;
  char *pcVar8;
  long *plVar9;
  long *plVar10;
  char *pcVar11;
  long lVar12;
  bool bVar13;
  int64_t eval_b;
  int64_t eval_a;
  char current_test [2048];
  long alStack_918 [2];
  undefined1 auStack_908 [16];
  code *pcStack_8f8;
  long lStack_8e8;
  long lStack_8e0;
  long alStack_8d8 [2];
  long alStack_8c8 [13];
  char *pcStack_860;
  undefined8 local_858;
  ulong local_850;
  char *local_848;
  long local_840;
  char local_838 [2056];
  
  uVar7 = 0;
  lVar12 = 0;
  while( true ) {
    __s = local_838;
    local_858 = 0x12;
    local_850 = uVar7;
    if (0x11 < (long)uVar7) break;
    pcVar1 = (char *)(&DAT_0024dd68)[lVar12 * 2];
    pcStack_860 = (char *)0x1c59b6;
    snprintf(__s,0x800,"%s");
    if (local_838[0] == '\0') {
      pcVar11 = (char *)0x0;
    }
    else {
      pcVar8 = pcVar1;
      cVar2 = *pcVar1;
      pcVar11 = __s;
      cVar4 = local_838[0];
      do {
        while (cVar2 != '\0') {
          pcVar8 = pcVar8 + 1;
          if (cVar4 == cVar2) {
            *pcVar11 = '\0';
            pcVar11 = pcVar11 + 1;
            goto LAB_001c5a09;
          }
          cVar2 = *pcVar8;
        }
        cVar4 = pcVar11[1];
        pcVar11 = pcVar11 + 1;
        pcVar8 = pcVar1;
        cVar2 = *pcVar1;
      } while (cVar4 != '\0');
      pcVar11 = (char *)0x0;
    }
LAB_001c5a09:
    local_848 = pcVar1;
    if (tokens[uVar7] == (char *)0x0) {
LAB_001c5a21:
      local_850 = 0;
    }
    else {
      pcStack_860 = (char *)0x1c5a1a;
      iVar5 = strcmp(__s,tokens[uVar7]);
      if (iVar5 != 0) goto LAB_001c5a21;
      local_850 = 1;
    }
    pcVar1 = local_848;
    local_858 = 0;
    local_840 = lVar12;
    if (local_850 == 0) {
LAB_001c5b6f:
      pcStack_860 = (char *)0x1c5b7c;
      run_test_strtok_cold_4();
      break;
    }
    uVar7 = uVar7 + 1;
    do {
      local_858 = 0x12;
      local_850 = uVar7;
      if (0x11 < (long)uVar7) {
        pcStack_860 = (char *)0x1c5b62;
        run_test_strtok_cold_2();
LAB_001c5b62:
        pcStack_860 = (char *)0x1c5b6f;
        run_test_strtok_cold_3();
        goto LAB_001c5b6f;
      }
      __s = (char *)CONCAT71((int7)((ulong)__s >> 8),pcVar11 == (char *)0x0);
      if (pcVar11 == (char *)0x0) {
        bVar13 = tokens[uVar7] == (char *)0x0;
        pcVar8 = (char *)0x0;
LAB_001c5ae8:
        local_850 = (ulong)(byte)(pcVar11 == (char *)0x0 & bVar13);
        pcVar11 = pcVar8;
      }
      else {
        cVar4 = *pcVar11;
        if (cVar4 != '\0') {
          cVar2 = *local_848;
          pcVar3 = pcVar1;
          pcVar8 = pcVar11;
          do {
            while (cVar2 != '\0') {
              if (cVar4 == cVar2) {
                *pcVar8 = '\0';
                pcVar8 = pcVar8 + 1;
                goto LAB_001c5aca;
              }
              cVar2 = pcVar3[1];
              pcVar3 = pcVar3 + 1;
            }
            cVar4 = pcVar8[1];
            pcVar8 = pcVar8 + 1;
            cVar2 = *local_848;
            pcVar3 = pcVar1;
          } while (cVar4 != '\0');
        }
        pcVar8 = (char *)0x0;
LAB_001c5aca:
        if (tokens[uVar7] == (char *)0x0) {
          bVar13 = true;
          goto LAB_001c5ae8;
        }
        pcStack_860 = (char *)0x1c5adb;
        iVar5 = strcmp(pcVar11,tokens[uVar7]);
        bVar13 = false;
        if (iVar5 != 0) goto LAB_001c5ae8;
        local_850 = 1;
        __s = (char *)0x0;
        pcVar11 = pcVar8;
      }
      local_858 = 0;
      if (local_850 == 0) goto LAB_001c5b62;
      uVar7 = uVar7 + 1;
    } while ((char)__s == '\0');
    lVar12 = local_840 + 1;
    if (lVar12 == 4) {
      return 0;
    }
  }
  pcStack_860 = "\x0f\x1f";
  run_test_strtok_cold_1();
  pcStack_8f8 = (code *)0x1c5baa;
  pcStack_860 = __s;
  iVar5 = uv_ip4_addr("0.0.0.0",0x23a3,alStack_8c8);
  alStack_8d8[0] = (long)iVar5;
  lStack_8e8 = 0;
  if (alStack_8d8[0] == 0) {
    pcStack_8f8 = (code *)0x1c5bcf;
    uVar6 = uv_default_loop();
    pcStack_8f8 = (code *)0x1c5bde;
    iVar5 = uv_tcp_init(uVar6,&server);
    alStack_8d8[0] = (long)iVar5;
    lStack_8e8 = 0;
    if (alStack_8d8[0] != 0) goto LAB_001c5e1d;
    pcStack_8f8 = (code *)0x1c5c11;
    iVar5 = uv_tcp_bind(&server,alStack_8c8,0);
    alStack_8d8[0] = (long)iVar5;
    lStack_8e8 = 0;
    if (alStack_8d8[0] != 0) goto LAB_001c5e2c;
    pcStack_8f8 = (code *)0x1c5c49;
    iVar5 = uv_listen(&server,0x80,connection_cb);
    alStack_8d8[0] = (long)iVar5;
    lStack_8e8 = 0;
    if (alStack_8d8[0] != 0) goto LAB_001c5e3b;
    pcStack_8f8 = (code *)0x1c5c7f;
    iVar5 = uv_ip4_addr("127.0.0.1",0x23a3,alStack_8d8);
    alStack_8c8[0] = (long)iVar5;
    lStack_8e8 = 0;
    if (alStack_8c8[0] != 0) goto LAB_001c5e4a;
    pcStack_8f8 = (code *)0x1c5ca4;
    uVar6 = uv_default_loop();
    pcStack_8f8 = (code *)0x1c5cb3;
    iVar5 = uv_tcp_init(uVar6,&client);
    alStack_8c8[0] = (long)iVar5;
    lStack_8e8 = 0;
    if (alStack_8c8[0] != 0) goto LAB_001c5e59;
    pcStack_8f8 = (code *)0x1c5cf0;
    iVar5 = uv_tcp_connect(alStack_8c8,&client,alStack_8d8,connect_cb);
    lStack_8e8 = (long)iVar5;
    lStack_8e0 = 0;
    if (lStack_8e8 != 0) goto LAB_001c5e68;
    pcStack_8f8 = (code *)0x1c5d15;
    uVar6 = uv_default_loop();
    pcStack_8f8 = (code *)0x1c5d1f;
    iVar5 = uv_run(uVar6,0);
    lStack_8e8 = (long)iVar5;
    lStack_8e0 = 0;
    if (lStack_8e8 != 0) goto LAB_001c5e77;
    lStack_8e8 = 1;
    lStack_8e0 = (long)connect_cb_called;
    if (lStack_8e0 != 1) goto LAB_001c5e86;
    lStack_8e8 = 1;
    lStack_8e0 = (long)connection_cb_called;
    if (lStack_8e0 != 1) goto LAB_001c5e95;
    lStack_8e8 = 3;
    lStack_8e0 = (long)close_cb_called;
    if (lStack_8e0 != 3) goto LAB_001c5ea4;
    pcStack_8f8 = (code *)0x1c5db3;
    __s = (char *)uv_default_loop();
    pcStack_8f8 = (code *)0x1c5dc7;
    uv_walk(__s,close_walk_cb,0);
    pcStack_8f8 = (code *)0x1c5dd1;
    uv_run(__s,0);
    lStack_8e8 = 0;
    pcStack_8f8 = (code *)0x1c5ddf;
    uVar6 = uv_default_loop();
    pcStack_8f8 = (code *)0x1c5de7;
    iVar5 = uv_loop_close(uVar6);
    lStack_8e0 = (long)iVar5;
    if (lStack_8e8 == lStack_8e0) {
      pcStack_8f8 = (code *)0x1c5e03;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_8f8 = (code *)0x1c5e1d;
    run_test_tcp_alloc_cb_fail_cold_1();
LAB_001c5e1d:
    pcStack_8f8 = (code *)0x1c5e2c;
    run_test_tcp_alloc_cb_fail_cold_2();
LAB_001c5e2c:
    pcStack_8f8 = (code *)0x1c5e3b;
    run_test_tcp_alloc_cb_fail_cold_3();
LAB_001c5e3b:
    pcStack_8f8 = (code *)0x1c5e4a;
    run_test_tcp_alloc_cb_fail_cold_4();
LAB_001c5e4a:
    pcStack_8f8 = (code *)0x1c5e59;
    run_test_tcp_alloc_cb_fail_cold_5();
LAB_001c5e59:
    pcStack_8f8 = (code *)0x1c5e68;
    run_test_tcp_alloc_cb_fail_cold_6();
LAB_001c5e68:
    pcStack_8f8 = (code *)0x1c5e77;
    run_test_tcp_alloc_cb_fail_cold_7();
LAB_001c5e77:
    pcStack_8f8 = (code *)0x1c5e86;
    run_test_tcp_alloc_cb_fail_cold_8();
LAB_001c5e86:
    pcStack_8f8 = (code *)0x1c5e95;
    run_test_tcp_alloc_cb_fail_cold_9();
LAB_001c5e95:
    pcStack_8f8 = (code *)0x1c5ea4;
    run_test_tcp_alloc_cb_fail_cold_10();
LAB_001c5ea4:
    pcStack_8f8 = (code *)0x1c5eb3;
    run_test_tcp_alloc_cb_fail_cold_11();
  }
  plVar9 = &lStack_8e8;
  iVar5 = (int)&lStack_8e0;
  pcStack_8f8 = connect_cb;
  run_test_tcp_alloc_cb_fail_cold_12();
  plVar10 = alStack_918;
  auStack_908._0_8_ = SEXT48(iVar5);
  alStack_918[0] = 0;
  pcStack_8f8 = (code *)__s;
  if (auStack_908._0_8_ == 0) {
    connect_cb_called = connect_cb_called + 1;
    auStack_908 = uv_buf_init(hello,7);
    iVar5 = uv_write(&write_req,plVar9[10],auStack_908,1,write_cb);
    alStack_918[0] = (long)iVar5;
    alStack_918[1] = 0;
    if (alStack_918[0] == 0) {
      return iVar5;
    }
  }
  else {
    connect_cb_cold_1();
  }
  iVar5 = (int)alStack_918 + 8;
  connect_cb_cold_2();
  if (iVar5 == 0) {
    iVar5 = uv_tcp_init(*(undefined8 *)((long)plVar10 + 8),&incoming);
    if (iVar5 != 0) goto LAB_001c6028;
    iVar5 = uv_accept(plVar10,&incoming);
    if (iVar5 == 0) {
      iVar5 = uv_read_start(&incoming,conn_alloc_cb,conn_read_cb);
      if (iVar5 == 0) {
        connection_cb_called = connection_cb_called + 1;
        return 0;
      }
      goto LAB_001c6042;
    }
  }
  else {
    connection_cb_cold_1();
LAB_001c6028:
    connection_cb_cold_2();
  }
  connection_cb_cold_3();
LAB_001c6042:
  connection_cb_cold_4();
  return extraout_EAX;
}

Assistant:

TEST_IMPL(strtok) {
  struct strtok_test_case tests[] = {
    { "abc", "" },
    { "abc.abf", "." },
    { "This;is.a:test:of=the/string\\tokenizer-function.", "\\/:;=-" },
    { "Hello This-is-a-nice.-string", " ." },
  };
  size_t tokens_len = ARRAY_SIZE(tokens);
  size_t tests_len = ARRAY_SIZE(tests);
  size_t i;
  size_t j;
  char* itr;
  char* tok_r;
  char current_test[2048];

  for (i = 0, j = 0; i < tests_len; i += 1) {
    ASSERT_LT(j, tokens_len);
    snprintf(current_test, sizeof(current_test), "%s", tests[i].str);
    tok_r = uv__strtok(current_test, tests[i].sep, &itr);
    ASSERT_STRCMP(tok_r, tokens[j]);
    j++;
    while (tok_r) {
      ASSERT_LT(j, tokens_len);
      tok_r = uv__strtok(NULL, tests[i].sep, &itr);
      ASSERT_STRCMP(tok_r, tokens[j]);
      j++;
    }
  }
  return 0;
}